

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_copy_database.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::BindCopyDatabaseSchema
          (Binder *this,Catalog *from_database,string *target_database_name)

{
  char cVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  CopyDatabaseInfo *pCVar3;
  _Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false> _Var4;
  pointer pCVar5;
  create_info_set_t *pcVar6;
  pointer pCVar7;
  LogicalCopyDatabase *this_00;
  long *in_RCX;
  _Hash_node_base *p_Var8;
  value_type altered_dep;
  LogicalDependencyList altered_dependencies;
  _Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false> local_100;
  _Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false> local_f8;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_f0;
  CopyDatabaseInfo *local_e8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_e0;
  CopyDatabaseInfo *local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  reference_wrapper<duckdb::CatalogEntry> local_b8 [2];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  PhysicalExport::GetNaiveExportOrder
            ((catalog_entry_vector_t *)local_d0,
             (ClientContext *)(from_database->default_table)._M_dataplus._M_p,
             (Catalog *)target_database_name);
  local_f8._M_head_impl = (CopyDatabaseInfo *)local_d0;
  local_e8 = (CopyDatabaseInfo *)local_c8._M_p;
  pCVar3 = (CopyDatabaseInfo *)operator_new(0x48);
  (pCVar3->super_ParseInfo).info_type = COPY_DATABASE_INFO;
  (pCVar3->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__CopyDatabaseInfo_02469378;
  (pCVar3->target_database)._M_dataplus._M_p = (pointer)&(pCVar3->target_database).field_2;
  local_e0._M_head_impl = (LogicalOperator *)this;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar3->target_database,*in_RCX,in_RCX[1] + *in_RCX);
  (pCVar3->entries).
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar3->entries).
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar3->entries).
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100._M_head_impl = pCVar3;
  if (local_f8._M_head_impl != local_e8) {
    _Var4._M_head_impl = local_f8._M_head_impl;
    do {
      local_d8 = _Var4._M_head_impl;
      (*((CatalogEntry *)((_Var4._M_head_impl)->super_ParseInfo)._vptr_ParseInfo)->
        _vptr_CatalogEntry[8])(&local_f0);
      pCVar5 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                           *)&local_f0);
      ::std::__cxx11::string::_M_assign((string *)&pCVar5->catalog);
      pCVar5 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                           *)&local_f0);
      cVar1 = (pCVar5->super_ParseInfo).field_0x9;
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      pCVar5 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                           *)&local_f0);
      pcVar6 = LogicalDependencyList::Set(&pCVar5->dependencies);
      for (p_Var8 = (pcVar6->_M_h)._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
          p_Var8 = p_Var8->_M_nxt) {
        local_d0[0] = *(undefined1 *)&p_Var8[1]._M_nxt;
        local_c8._M_p = (pointer)local_b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,p_Var8[2]._M_nxt,
                   (long)&(p_Var8[3]._M_nxt)->_M_nxt + (long)p_Var8[2]._M_nxt);
        local_a8._M_p = local_98;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,p_Var8[6]._M_nxt,
                   (long)&(p_Var8[7]._M_nxt)->_M_nxt + (long)p_Var8[6]._M_nxt);
        local_88._M_p = local_78;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,p_Var8[10]._M_nxt,
                   (long)&(p_Var8[0xb]._M_nxt)->_M_nxt + (long)p_Var8[10]._M_nxt);
        ::std::__cxx11::string::_M_assign((string *)&local_88);
        LogicalDependencyList::AddDependency
                  ((LogicalDependencyList *)&local_68,(LogicalDependency *)local_d0);
        if (local_88._M_p != local_78) {
          operator_delete(local_88._M_p);
        }
        if (local_a8._M_p != local_98) {
          operator_delete(local_a8._M_p);
        }
        if ((reference_wrapper<duckdb::CatalogEntry> *)local_c8._M_p != local_b8) {
          operator_delete(local_c8._M_p);
        }
      }
      pCVar5 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                           *)&local_f0);
      if (&local_68 !=
          (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pCVar5->dependencies) {
        ::std::
        _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pCVar5->dependencies,&local_68);
      }
      pCVar5 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                           *)&local_f0);
      pCVar5->on_conflict = cVar1 == '\x02';
      pCVar7 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
               ::operator->((unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
                             *)&local_100);
      ::std::
      vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
                ((vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>>
                  *)&pCVar7->entries,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 &local_f0);
      ::std::
      _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      if (local_f0._M_head_impl != (CreateInfo *)0x0) {
        (*((local_f0._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      _Var4._M_head_impl = (CopyDatabaseInfo *)&(local_d8->super_ParseInfo).info_type;
    } while (_Var4._M_head_impl != local_e8);
  }
  this_00 = (LogicalCopyDatabase *)operator_new(0x70);
  local_d0 = (undefined1  [8])local_100._M_head_impl;
  local_100._M_head_impl = (CopyDatabaseInfo *)0x0;
  LogicalCopyDatabase::LogicalCopyDatabase
            (this_00,(unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
                      *)local_d0);
  _Var2._M_head_impl = local_e0._M_head_impl;
  if (local_d0 != (undefined1  [8])0x0) {
    (*(code *)((CatalogEntry *)((ParseInfo *)local_d0)->_vptr_ParseInfo)->oid)();
  }
  (_Var2._M_head_impl)->_vptr_LogicalOperator = (_func_int **)this_00;
  if (local_100._M_head_impl != (CopyDatabaseInfo *)0x0) {
    (*((local_100._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  if (local_f8._M_head_impl != (CopyDatabaseInfo *)0x0) {
    operator_delete(local_f8._M_head_impl);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::BindCopyDatabaseSchema(Catalog &from_database, const string &target_database_name) {

	catalog_entry_vector_t catalog_entries;
	catalog_entries = PhysicalExport::GetNaiveExportOrder(context, from_database);

	auto info = make_uniq<CopyDatabaseInfo>(target_database_name);
	for (auto &entry : catalog_entries) {
		auto create_info = entry.get().GetInfo();
		create_info->catalog = target_database_name;
		auto on_conflict = create_info->type == CatalogType::SCHEMA_ENTRY ? OnCreateConflict::IGNORE_ON_CONFLICT
		                                                                  : OnCreateConflict::ERROR_ON_CONFLICT;
		// Update all the dependencies of the entry to point to the newly created entries on the target database
		LogicalDependencyList altered_dependencies;
		for (auto &dep : create_info->dependencies.Set()) {
			auto altered_dep = dep;
			altered_dep.catalog = target_database_name;
			altered_dependencies.AddDependency(altered_dep);
		}
		create_info->dependencies = altered_dependencies;
		create_info->on_conflict = on_conflict;
		info->entries.push_back(std::move(create_info));
	}

	return make_uniq<LogicalCopyDatabase>(std::move(info));
}